

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::Image::printSearchPath(void)

{
  undefined8 *puVar1;
  size_t sVar2;
  int local_1c;
  char *pcStack_18;
  int i;
  char *p;
  ImageGlobals *g;
  
  puVar1 = (undefined8 *)(engine + imageModuleOffset);
  pcStack_18 = (char *)*puVar1;
  for (local_1c = 0; local_1c < *(int *)(puVar1 + 1); local_1c = local_1c + 1) {
    printf("%s\n",pcStack_18);
    sVar2 = strlen(pcStack_18);
    pcStack_18 = pcStack_18 + sVar2 + 1;
  }
  return;
}

Assistant:

void
Image::printSearchPath(void)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	char *p = g->searchPaths;
	for(int i = 0; i < g->numSearchPaths; i++){
		printf("%s\n", p);
		p += strlen(p) + 1;
	}
}